

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O3

void __thiscall
poplar::
map<poplar::plain_fkhash_trie<90U,_poplar::hash::vigna_hasher>,_poplar::compact_fkhash_nlm<int,_16UL>_>
::map(map<poplar::plain_fkhash_trie<90U,_poplar::hash::vigna_hasher>,_poplar::compact_fkhash_nlm<int,_16UL>_>
      *this,uint32_t capa_bits,uint64_t lambda)

{
  undefined1 auVar1 [48];
  pointer puVar2;
  pointer puVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [16];
  undefined8 *puVar6;
  uint32_t uVar7;
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 local_a8 [112];
  size_p2 sStack_38;
  size_p2 sStack_28;
  
  auVar8 = ZEXT1664((undefined1  [16])0x0);
  this->is_ready_ = false;
  this->lambda_ = 0x20;
  (this->hash_trie_).capa_size_.mask_ = 0;
  (this->hash_trie_).symb_size_.bits_ = 0;
  auVar9 = vmovdqu64_avx512f(auVar8);
  auVar1 = auVar9._0_48_;
  (this->hash_trie_).table_.chunks_ =
       (vector<unsigned_long,_std::allocator<unsigned_long>_>)auVar1._0_24_;
  (this->hash_trie_).table_.size_ = auVar1._24_8_;
  (this->hash_trie_).table_.mask_ = auVar1._32_8_;
  (this->hash_trie_).table_.width_ = auVar1._40_8_;
  (this->hash_trie_).ids_.chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)auVar9._48_8_;
  (this->hash_trie_).ids_.chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)auVar9._56_8_;
  auVar9 = vmovdqu64_avx512f(auVar8);
  *(undefined1 (*) [64])
   ((long)&(this->hash_trie_).ids_.chunks_.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start + 4) = auVar9;
  this->size_ = 0;
  auVar9 = vmovdqu64_avx512f(auVar8);
  *(undefined1 (*) [64])((this->codes_)._M_elems + 0xb8) = auVar9;
  auVar9 = vmovdqu64_avx512f(auVar8);
  *(undefined1 (*) [64])&(this->hash_trie_).symb_size_.mask_ = auVar9;
  auVar9 = vmovdqu64_avx512f(auVar8);
  *(undefined1 (*) [64])&(this->label_store_).label_bytes_ = auVar9;
  auVar9 = vmovdqu64_avx512f(auVar8);
  *(undefined1 (*) [64])((this->codes_)._M_elems + 0x38) = auVar9;
  auVar9 = vmovdqu64_avx512f(auVar8);
  *(undefined1 (*) [64])((this->codes_)._M_elems + 0x78) = auVar9;
  auVar9 = vmovdqu64_avx512f(auVar8);
  *(undefined1 (*) [64])((this->codes_)._M_elems + 0xc4) = auVar9;
  if ((int)POPCOUNT(lambda) == 1) {
    this->is_ready_ = true;
    this->lambda_ = lambda;
    uVar7 = 8;
    if (1 < lambda) {
      uVar7 = 0x48 - (int)LZCOUNT(lambda - 1);
    }
    plain_fkhash_trie<90U,_poplar::hash::vigna_hasher>::plain_fkhash_trie
              ((plain_fkhash_trie<90U,_poplar::hash::vigna_hasher> *)local_a8,capa_bits,uVar7);
    puVar2 = (this->hash_trie_).table_.chunks_.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar3 = (this->hash_trie_).table_.chunks_.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    (this->hash_trie_).table_.chunks_.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_a8._0_8_;
    (this->hash_trie_).table_.chunks_.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_a8._8_8_;
    (this->hash_trie_).table_.chunks_.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_a8._16_8_;
    local_a8._0_8_ = (pointer)0x0;
    local_a8._8_8_ = (pointer)0x0;
    local_a8._16_8_ = (pointer)0x0;
    if (puVar2 != (pointer)0x0) {
      operator_delete(puVar2,(long)puVar3 - (long)puVar2);
    }
    (this->hash_trie_).table_.width_ = local_a8._40_8_;
    (this->hash_trie_).table_.size_ = local_a8._24_8_;
    (this->hash_trie_).table_.mask_ = local_a8._32_8_;
    puVar2 = (this->hash_trie_).ids_.chunks_.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar3 = (this->hash_trie_).ids_.chunks_.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    (this->hash_trie_).ids_.chunks_.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_a8._48_8_;
    (this->hash_trie_).ids_.chunks_.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_a8._56_8_;
    (this->hash_trie_).ids_.chunks_.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_a8._64_8_;
    local_a8._48_8_ = (pointer)0x0;
    local_a8._56_8_ = (pointer)0x0;
    local_a8._64_8_ = (pointer)0x0;
    if (puVar2 != (pointer)0x0) {
      operator_delete(puVar2,(long)puVar3 - (long)puVar2);
    }
    (this->hash_trie_).ids_.width_ = local_a8._88_8_;
    (this->hash_trie_).ids_.size_ = local_a8._72_8_;
    (this->hash_trie_).ids_.mask_ = local_a8._80_8_;
    auVar4._16_8_ = sStack_38._0_8_;
    auVar4._0_16_ = local_a8._96_16_;
    auVar4._24_8_ = sStack_38.mask_;
    auVar5 = auVar4._16_16_;
    (this->hash_trie_).size_ = local_a8._96_8_;
    (this->hash_trie_).max_size_ = local_a8._104_8_;
    (this->hash_trie_).capa_size_.bits_ = auVar5._0_4_;
    *(int *)&(this->hash_trie_).capa_size_.field_0x4 = auVar5._4_4_;
    (this->hash_trie_).capa_size_.mask_ = auVar5._8_8_;
    (this->hash_trie_).capa_size_.bits_ = sStack_38.bits_;
    *(undefined4 *)&(this->hash_trie_).capa_size_.field_0x4 = sStack_38._4_4_;
    (this->hash_trie_).capa_size_.mask_ = sStack_38.mask_;
    (this->hash_trie_).symb_size_.bits_ = sStack_28.bits_;
    *(undefined4 *)&(this->hash_trie_).symb_size_.field_0x4 = sStack_28._4_4_;
    (this->hash_trie_).symb_size_.mask_ = sStack_28.mask_;
    auVar9 = ZEXT1664(local_a8._96_16_);
    plain_fkhash_trie<90U,_poplar::hash::vigna_hasher>::~plain_fkhash_trie
              ((plain_fkhash_trie<90U,_poplar::hash::vigna_hasher> *)local_a8);
    compact_fkhash_nlm<int,_16UL>::compact_fkhash_nlm
              ((compact_fkhash_nlm<int,_16UL> *)local_a8,(this->hash_trie_).capa_size_.bits_);
    compact_fkhash_nlm<int,_16UL>::operator=
              (&this->label_store_,(compact_fkhash_nlm<int,_16UL> *)local_a8);
    compact_fkhash_nlm<int,_16UL>::~compact_fkhash_nlm((compact_fkhash_nlm<int,_16UL> *)local_a8);
    auVar8 = vpternlogd_avx512f(auVar9,auVar9,auVar9,0xff);
    auVar9 = vmovdqu64_avx512f(auVar8);
    *(undefined1 (*) [64])(this->codes_)._M_elems = auVar9;
    auVar9 = vmovdqu64_avx512f(auVar8);
    *(undefined1 (*) [64])((this->codes_)._M_elems + 0xc0) = auVar9;
    auVar9 = vmovdqu64_avx512f(auVar8);
    *(undefined1 (*) [64])((this->codes_)._M_elems + 0x80) = auVar9;
    auVar9 = vmovdqu64_avx512f(auVar8);
    *(undefined1 (*) [64])((this->codes_)._M_elems + 0x40) = auVar9;
    uVar7 = this->num_codes_;
    this->num_codes_ = uVar7 + 1;
    (this->codes_)._M_elems[0] = (uchar)uVar7;
    return;
  }
  puVar6 = (undefined8 *)__cxa_allocate_exception(0x10);
  *puVar6 = &PTR__exception_00183a50;
  puVar6[1] = 
  "/workspace/llm4binary/github/license_c_cmakelists/kampersanda[P]poplar-trie/include/poplar/map.hpp:57:lambda must be a power of 2."
  ;
  __cxa_throw(puVar6,&exception::typeinfo,std::exception::~exception);
}

Assistant:

explicit map(uint32_t capa_bits, uint64_t lambda = 32) {
        POPLAR_THROW_IF(!is_power2(lambda), "lambda must be a power of 2.");

        is_ready_ = true;
        lambda_ = lambda;
        hash_trie_ = Trie{capa_bits, 8 + bit_tools::ceil_log2(lambda_)};
        label_store_ = NLM{hash_trie_.capa_bits()};
        codes_.fill(UINT8_MAX);
        codes_[0] = static_cast<uint8_t>(num_codes_++);  // terminator
    }